

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_ecdsa_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  EVP_PKEY *ecdsa_ctx;
  int iVar1;
  int iVar2;
  uint32_t len;
  size_t name_len;
  size_t s_len;
  size_t r_len;
  uchar *s;
  uchar *r;
  string_buf buf;
  uchar *name;
  uint local_6c;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  uchar *local_50;
  uchar *local_48;
  string_buf local_40;
  uchar *local_28;
  
  iVar2 = -1;
  if (0x22 < sig_len) {
    ecdsa_ctx = (EVP_PKEY *)*abstract;
    local_40.data = sig;
    local_40.dataptr = sig;
    local_40.len = sig_len;
    iVar1 = _libssh2_get_string(&local_40,&local_28,&local_68);
    if ((iVar1 == 0) && (local_68 == 0x13)) {
      iVar1 = _libssh2_get_u32(&local_40,&local_6c);
      if ((iVar1 == 0) && (7 < local_6c)) {
        iVar1 = _libssh2_get_string(&local_40,&local_48,&local_58);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_string(&local_40,&local_50,&local_60);
          if (iVar1 == 0) {
            iVar2 = _libssh2_ecdsa_verify(ecdsa_ctx,local_48,local_58,local_50,local_60,m,m_len);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_sig_verify(LIBSSH2_SESSION * session,
                                    const unsigned char *sig,
                                    size_t sig_len,
                                    const unsigned char *m,
                                    size_t m_len, void **abstract)
{
    unsigned char *r, *s, *name;
    size_t r_len, s_len, name_len;
    uint32_t len;
    struct string_buf buf;
    libssh2_ecdsa_ctx *ctx = (libssh2_ecdsa_ctx *) (*abstract);

    (void)session;

    if(sig_len < 35)
        return -1;

    /* keyname_len(4) + keyname(19){"ecdsa-sha2-nistp256"} +
       signature_len(4) */
    buf.data = (unsigned char *)sig;
    buf.dataptr = buf.data;
    buf.len = sig_len;

    if(_libssh2_get_string(&buf, &name, &name_len) || name_len != 19)
        return -1;

    if(_libssh2_get_u32(&buf, &len) != 0 || len < 8)
        return -1;

    if(_libssh2_get_string(&buf, &r, &r_len))
        return -1;

    if(_libssh2_get_string(&buf, &s, &s_len))
        return -1;

    return _libssh2_ecdsa_verify(ctx, r, r_len, s, s_len, m, m_len);
}